

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

void handle_post_wall_step
               (chunk_conflict *c,loc_conflict *grid,loc_conflict *dir,_Bool *door_flag,
               int *bend_intvl)

{
  wchar_t wVar1;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc *plVar2;
  int iVar3;
  _Bool _Var4;
  uint32_t uVar5;
  loc_conflict grid_03;
  
  if ((dir->x == 0) || (dir->y == 0)) {
    *bend_intvl = 1;
    return;
  }
  grid_03 = loc_sum(*grid,*dir);
  *grid = grid_03;
  _Var4 = square_is_granite_with_flag(c,grid_03,L'\f');
  if ((!_Var4) &&
     (((_Var4 = square_is_granite_with_flag(c,*grid,L'\r'), !_Var4 &&
       (_Var4 = square_is_granite_with_flag(c,*grid,L'\v'), !_Var4)) &&
      (grid_00.x = grid->x, grid_00.y = grid->y, _Var4 = square_isperm(c,grid_00), !_Var4)))) {
    grid_01.x = grid->x;
    grid_01.y = grid->y;
    _Var4 = square_isroom(c,grid_01);
    if ((!_Var4) &&
       (grid_02.x = grid->x, grid_02.y = grid->y, _Var4 = square_isgranite(c,grid_02), _Var4)) {
      wVar1 = dun->tunn_n;
      if (wVar1 < (int)(uint)z_info->tunn_grid_max) {
        plVar2 = dun->tunn;
        iVar3 = grid->y;
        plVar2[wVar1].x = grid->x;
        plVar2[wVar1].y = iVar3;
        dun->tunn_n = dun->tunn_n + L'\x01';
      }
      *door_flag = false;
    }
    *bend_intvl = 0;
    uVar5 = Rand_div(0x8000);
    if ((int)uVar5 < 0x4000) {
      dir->x = 0;
      return;
    }
    dir->y = 0;
    return;
  }
  __assert_fail("!square_is_granite_with_flag(c, *grid, SQUARE_WALL_OUTER) && !square_is_granite_with_flag(c, *grid, SQUARE_WALL_SOLID) && !square_is_granite_with_flag(c, *grid, SQUARE_WALL_INNER) && !square_isperm(c, *grid)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                ,0x162,
                "void handle_post_wall_step(struct chunk *, struct loc *, struct loc *, _Bool *, int *)"
               );
}

Assistant:

static void handle_post_wall_step(struct chunk *c, struct loc *grid,
	struct loc *dir, bool *door_flag, int *bend_intvl)
{
	if (dir->x != 0 && dir->y != 0) {
		/*
		 * Take a diagonal step upon leaving the wall.  Proceed to that.
		 */
		*grid = loc_sum(*grid, *dir);
		assert(!square_is_granite_with_flag(c, *grid, SQUARE_WALL_OUTER) &&
			!square_is_granite_with_flag(c, *grid, SQUARE_WALL_SOLID) &&
			!square_is_granite_with_flag(c, *grid, SQUARE_WALL_INNER) &&
			!square_isperm(c, *grid));

		if (!square_isroom(c, *grid) && square_isgranite(c, *grid)) {
			/* Save the tunnel location */
			if (dun->tunn_n < z_info->tunn_grid_max) {
				dun->tunn[dun->tunn_n] = *grid;
				dun->tunn_n++;
			}

			/* Allow door in next grid */
			*door_flag = false;
		}

		/*
		 * Having pierced the wall and taken a step, can forget about
		 * what was set to suppress bends in the past.
		 */
		*bend_intvl = 0;

		/*
		 * Now choose a cardinal direction, one that is +/-45 degrees
		 * from what was used for the diagonal step, for the next step
		 * since the tunnel iterations want a cardinal direction.
		 */
		if (randint0(32768) < 16384) {
			dir->x = 0;
		} else {
			dir->y = 0;
		}
	} else {
		/*
		 * Take a cardinal step upon leaving the wall.  Most of the
		 * passed in state is fine, but temporarily suppress bends so
		 * the step will be handled as is by the next iteration of
		 * tunnel building.
		 */
		*bend_intvl = 1;
	}
}